

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

Expr str_from_list(pExecutor exec,pContext_conflict defContext,pContext_conflict callContext,
                  Expr *args,int argc)

{
  _Bool _Var1;
  Expr *__ptr;
  size_t len_00;
  pString value;
  size_t sVar2;
  char *__s;
  anon_union_8_8_707b72ea_for_Expr_1 *paVar3;
  Expr EVar4;
  Expr EVar5;
  Expr EVar6;
  Expr ptr;
  Expr expr;
  Expr expr_00;
  Expr expr_01;
  int len;
  
  if (argc < 2) {
    __s = "__str-from-list: too few arguments";
  }
  else if (argc == 2) {
    EVar4._4_4_ = 0;
    EVar4.type = args->type;
    EVar4.field_1.val_atom = (args->field_1).val_atom;
    EVar4 = exec_eval(exec,callContext,EVar4);
    expr_01.field_1 = EVar4.field_1;
    EVar5._4_4_ = 0;
    EVar5.type = args[1].type;
    EVar5.field_1.val_atom = args[1].field_1.val_atom;
    EVar5 = exec_eval(exec,callContext,EVar5);
    ptr._4_4_ = 0;
    ptr.type = EVar5.type;
    ptr.field_1.val_atom = EVar5.field_1.val_atom;
    EVar5 = dereference(ptr);
    expr_01._4_4_ = 0;
    expr_01.type = EVar4.type;
    __ptr = get_list(exec,expr_01,&len);
    len_00 = longint_to_long(EVar5.field_1.val_int);
    value = string_allocate_memory(len_00);
    paVar3 = &__ptr->field_1;
    for (sVar2 = 0; len_00 != sVar2; sVar2 = sVar2 + 1) {
      expr._4_4_ = 0;
      expr.type = ((Expr *)(paVar3 + -1))->type;
      expr.field_1.val_atom = paVar3->val_atom;
      _Var1 = is_char(expr);
      if (!_Var1) {
        free_string(value);
        __s = "__str-from-list: `list` argument must contain only characters";
        goto LAB_001050f7;
      }
      value->buf[sVar2] = paVar3->val_char;
      paVar3 = paVar3 + 2;
    }
    free(__ptr);
    EVar4 = make_string(exec,value);
    EVar6.field_1 = EVar4.field_1;
    EVar6.type = EVar4.type;
    free_string(value);
    expr_00._4_4_ = 0;
    expr_00.type = EVar6.type;
    expr_00.field_1.val_atom = EVar6.field_1.val_atom;
    _Var1 = is_none(expr_00);
    if (!_Var1) {
      EVar6._4_4_ = 0;
      return EVar6;
    }
    __s = "__str-from-list: make_string failed";
  }
  else {
    __s = "__str-from-list: too many arguments";
  }
LAB_001050f7:
  puts(__s);
  exit(1);
}

Assistant:

BUILTIN_FUNC(str_from_list)
{
    if (argc < 2)
    {
        log("__str-from-list: too few arguments");
        exit(1);
    }
    if (argc > 2)
    {
        log("__str-from-list: too many arguments");
        exit(1);
    }
    // Evaluate all arguments
    Expr list = exec_eval(exec, callContext, args[0]);
    Expr length = dereference(exec_eval(exec, callContext, args[1]));

    int len;
    Expr *items = get_list(exec, list, &len);

    size_t res_len = (size_t) longint_to_long(length.val_int);

    pString str = string_allocate_memory(res_len);
    for (size_t i = 0; i < res_len; i++)
    {
        if (!is_char(items[i]))
        {
            free_string(str);
            log("__str-from-list: `list` argument must contain only characters");
            exit(1);
        }
        str->buf[i] = items[i].val_char;
    }
    free(items);

    Expr res = make_string(exec, str);
    free_string(str);
    if (is_none(res))
    {
        log("__str-from-list: make_string failed");
        exit(1);
    }
    return res;
}